

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::GetLabelAt
          (BinaryReaderIR *this,LabelNode **label,Index depth)

{
  size_type sVar1;
  reference pvVar2;
  Index depth_local;
  LabelNode **label_local;
  BinaryReaderIR *this_local;
  
  sVar1 = std::
          vector<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
          ::size(&this->label_stack_);
  if (depth < sVar1) {
    sVar1 = std::
            vector<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
            ::size(&this->label_stack_);
    pvVar2 = std::
             vector<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
             ::operator[](&this->label_stack_,(sVar1 - depth) - 1);
    *label = pvVar2;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    sVar1 = std::
            vector<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
            ::size(&this->label_stack_);
    PrintError(this,"accessing stack depth: %u >= max: %zd",(ulong)depth,sVar1);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::GetLabelAt(LabelNode** label, Index depth) {
  if (depth >= label_stack_.size()) {
    PrintError("accessing stack depth: %" PRIindex " >= max: %" PRIzd, depth,
               label_stack_.size());
    return Result::Error;
  }

  *label = &label_stack_[label_stack_.size() - depth - 1];
  return Result::Ok;
}